

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * testing::internal::XmlUnitTestResultPrinter::RemoveInvalidXmlCharacters
                   (string *__return_storage_ptr__,string *str)

{
  byte bVar1;
  size_type sVar2;
  byte *pbVar3;
  byte *pbVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  sVar2 = str->_M_string_length;
  if (sVar2 != 0) {
    pbVar3 = (byte *)(str->_M_dataplus)._M_p;
    pbVar4 = pbVar3;
    do {
      bVar1 = *pbVar4;
      if ((0x1f < bVar1) || ((bVar1 < 0xe && ((0x2600U >> (bVar1 & 0x1f) & 1) != 0)))) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        pbVar3 = (byte *)(str->_M_dataplus)._M_p;
        sVar2 = str->_M_string_length;
      }
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != pbVar3 + sVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string XmlUnitTestResultPrinter::RemoveInvalidXmlCharacters(
    const std::string& str) {
  std::string output;
  output.reserve(str.size());
  for (std::string::const_iterator it = str.begin(); it != str.end(); ++it)
    if (IsValidXmlCharacter(static_cast<unsigned char>(*it)))
      output.push_back(*it);

  return output;
}